

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

double calc_mean_only<double,unsigned_long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  unsigned_long uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  ulong local_90;
  ulong local_78;
  
  uVar9 = Xc_indptr[col_num];
  uVar4 = Xc_indptr[col_num + 1];
  if (uVar9 == uVar4) {
    return 0.0;
  }
  puVar1 = Xc_ind + uVar4;
  uVar5 = puVar1[-1];
  puVar3 = ix_arr + end + 1;
  puVar7 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar3);
  local_78 = (end - st) + 1;
  dVar10 = 0.0;
  local_90 = 0;
LAB_00220a69:
  puVar2 = Xc_ind + uVar9;
  do {
    if (((puVar7 == puVar3) || (uVar9 == uVar4)) || (uVar6 = *puVar7, uVar5 < uVar6)) {
LAB_00220b80:
      if (local_90 == 0) {
        return 0.0;
      }
      if (local_78 <= local_90) {
        return dVar10;
      }
      return (double)((((float)(long)local_90 + (float)(&DAT_003250d8)[(long)local_90 < 0]) /
                      ((float)(long)local_78 + (float)(&DAT_003250d8)[(long)local_78 < 0])) *
                     (float)dVar10);
    }
    if (*puVar2 == uVar6) {
      if ((ulong)ABS(Xc[uVar9]) < 0x7ff0000000000000) {
        local_90 = local_90 + 1;
        auVar11._8_4_ = (int)(local_90 >> 0x20);
        auVar11._0_8_ = local_90;
        auVar11._12_4_ = 0x45300000;
        dVar10 = dVar10 + (Xc[uVar9] - dVar10) /
                          ((auVar11._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_90) - 4503599627370496.0));
      }
      else {
        local_78 = local_78 - 1;
      }
      if ((puVar7 == ix_arr + end) || (uVar9 == uVar4 - 1)) goto LAB_00220b80;
      puVar7 = puVar7 + 1;
      puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar2 + 1,puVar1,puVar7);
      uVar9 = (long)puVar8 - (long)Xc_ind >> 3;
      goto LAB_00220a69;
    }
    if (*puVar2 <= uVar6) break;
    puVar7 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar7 + 1,puVar3,puVar2);
  } while( true );
  puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (puVar2 + 1,puVar1,puVar7);
  uVar9 = (long)puVar8 - (long)Xc_ind >> 3;
  goto LAB_00220a69;
}

Assistant:

double calc_mean_only(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return 0;
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    double m = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
                cnt--;
            else
                m += (Xc[curr_pos] - m) / (double)(++added);

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
        return 0;

    if (cnt > added)
        m *= ((ldouble_safe)added / (ldouble_safe)cnt);

    return m;
}